

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darknet2ncnn.cpp
# Opt level: O0

string * trim(string *s)

{
  string *psVar1;
  string *in_RDI;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff58;
  undefined8 local_80;
  undefined1 local_70 [8];
  undefined1 local_68 [8];
  reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  char *local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_30;
  char *local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  string *local_8;
  
  local_8 = in_RDI;
  local_18 = std::__cxx11::string::begin();
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_RDI,in_stack_ffffffffffffff58);
  local_30 = std::__cxx11::string::begin();
  local_38 = std::__cxx11::string::end();
  local_28 = (char *)std::
                     find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,trim(std::__cxx11::string&)::_lambda(int)_1_>
                               (local_30,local_38);
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_RDI,in_stack_ffffffffffffff58);
  local_48 = std::__cxx11::string::erase(in_RDI,local_10,local_20);
  psVar1 = local_8;
  std::__cxx11::string::rbegin();
  std::__cxx11::string::rend();
  std::
  find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,trim(std::__cxx11::string&)::_lambda(int)_2_>
            (&local_60,local_68,local_70);
  local_58 = (char *)std::
                     reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::base(&local_60);
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_RDI,in_stack_ffffffffffffff58);
  std::__cxx11::string::end();
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_RDI,in_stack_ffffffffffffff58);
  std::__cxx11::string::erase(psVar1,local_50,local_80);
  return local_8;
}

Assistant:

static inline std::string& trim(std::string& s)
{
    s.erase(s.begin(), std::find_if(s.begin(), s.end(), [](int ch) {
        return !std::isspace(ch);
    }));
    s.erase(std::find_if(s.rbegin(), s.rend(), [](int ch) {
        return !std::isspace(ch);
    }).base(),
    s.end());
    return s;
}